

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-builder.h
# Opt level: O0

void __thiscall
mp::ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_>::AddObj
          (ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_> *this,Type type,NumericExpr expr,
          int num_linear_terms)

{
  Argument1 in_RDI;
  TestProblemBuilder *this_00;
  undefined1 local_41 [17];
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  int local_18;
  Type local_14 [4];
  
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xfffffffffffffffc;
  internal::Unused<mp::obj::Type,BasicTestExpr<0>*,int>
            (local_14,(BasicTestExpr<0> **)&stack0xffffffffffffffe0,&local_18);
  this_00 = (TestProblemBuilder *)local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  TestProblemBuilder::ReportUnhandledConstruct(this_00,in_RDI);
  std::__cxx11::string::~string((string *)(local_41 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_41);
  return;
}

Assistant:

LinearObjBuilder AddObj(
      obj::Type type, NumericExpr expr, int num_linear_terms) {
    internal::Unused(type, &expr, num_linear_terms);
    MP_DISPATCH(ReportUnhandledConstruct("objective"));
    return LinearObjBuilder();
  }